

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribUintCase::test
          (CurrentVertexAttribUintCase *this)

{
  GLuint x_00;
  GLuint y_00;
  GLuint z_00;
  GLuint w_00;
  GLuint w;
  GLuint z;
  GLuint y;
  GLuint x;
  int index;
  GLint local_24;
  undefined1 local_20 [4];
  int attribute_count;
  Random rnd;
  CurrentVertexAttribUintCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  local_24 = 0x10;
  glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,0x8869,&local_24);
  for (y = 0; (int)y < local_24; y = y + 1) {
    x_00 = de::Random::getInt((Random *)local_20,0,64000);
    y_00 = de::Random::getInt((Random *)local_20,0,64000);
    z_00 = de::Random::getInt((Random *)local_20,0,64000);
    w_00 = de::Random::getInt((Random *)local_20,0,64000);
    glu::CallLogWrapper::glVertexAttribI4ui
              (&(this->super_ApiCase).super_CallLogWrapper,y,x_00,y_00,z_00,w_00);
    verifyCurrentVertexAttribIui
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,y,x_00,y_00,z_00,w_00);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLuint x = rnd.getInt(0, 64000);
			const GLuint y = rnd.getInt(0, 64000);
			const GLuint z = rnd.getInt(0, 64000);
			const GLuint w = rnd.getInt(0, 64000);

			glVertexAttribI4ui(index, x, y, z, w);
			verifyCurrentVertexAttribIui(m_testCtx, *this, index, x, y, z, w);
		}
	}